

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedSeparateCase::init
          (ComputeShaderGeneratedSeparateCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *pRVar1;
  int iVar2;
  ShaderProgram *pSVar3;
  TestError *pTVar4;
  long lVar5;
  string local_148;
  uint local_128;
  value_type local_120;
  undefined1 local_100 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  if ((this->super_ComputeShaderGeneratedCase).m_computeCmd == true) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx;
    memset(local_100,0,0xac);
    local_50._0_8_ = (pointer)0x0;
    local_50[8] = 0;
    local_50._9_7_ = 0;
    local_50[0x10] = 0;
    local_50._17_8_ = 0;
    Functional::(anonymous_namespace)::ComputeShaderGeneratedCase::genComputeSource_abi_cxx11_
              (&local_148,this,true,false,false);
    local_128 = 5;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_148._M_dataplus._M_p,
               local_148._M_dataplus._M_p + local_148._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_128 * 0x18),&local_120);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar1,(ProgramSources *)local_100);
    this->m_computeCmdProgram = pSVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    ctx = (EVP_PKEY_CTX *)this->m_computeCmdProgram;
    glu::operator<<(((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log,(ShaderProgram *)ctx);
    if ((this->m_computeCmdProgram->m_program).m_info.linkOk == false) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"Failed to compile command compute shader.","");
      tcu::TestError::TestError(pTVar4,(string *)local_100);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeData == true) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx;
    memset(local_100,0,0xac);
    local_50._0_8_ = (pointer)0x0;
    local_50[8] = 0;
    local_50._9_7_ = 0;
    local_50[0x10] = 0;
    local_50._17_8_ = 0;
    Functional::(anonymous_namespace)::ComputeShaderGeneratedCase::genComputeSource_abi_cxx11_
              (&local_148,this,false,true,false);
    local_128 = 5;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_148._M_dataplus._M_p,
               local_148._M_dataplus._M_p + local_148._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_128 * 0x18),&local_120);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar1,(ProgramSources *)local_100);
    this->m_computeDataProgram = pSVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    ctx = (EVP_PKEY_CTX *)this->m_computeDataProgram;
    glu::operator<<(((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log,(ShaderProgram *)ctx);
    if ((this->m_computeDataProgram->m_program).m_info.linkOk == false) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"Failed to compile data compute shader.","");
      tcu::TestError::TestError(pTVar4,(string *)local_100);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeIndices == true) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx;
    memset(local_100,0,0xac);
    local_50._0_8_ = (pointer)0x0;
    local_50[8] = 0;
    local_50._9_7_ = 0;
    local_50[0x10] = 0;
    local_50._17_8_ = 0;
    Functional::(anonymous_namespace)::ComputeShaderGeneratedCase::genComputeSource_abi_cxx11_
              (&local_148,this,false,false,true);
    local_128 = 5;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_148._M_dataplus._M_p,
               local_148._M_dataplus._M_p + local_148._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_128 * 0x18),&local_120);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar1,(ProgramSources *)local_100);
    this->m_computeIndicesProgram = pSVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    ctx = (EVP_PKEY_CTX *)this->m_computeIndicesProgram;
    glu::operator<<(((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log,(ShaderProgram *)ctx);
    if ((this->m_computeIndicesProgram->m_program).m_info.linkOk == false) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"Failed to compile data compute shader.","");
      tcu::TestError::TestError(pTVar4,(string *)local_100);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar2 = ComputeShaderGeneratedCase::init(&this->super_ComputeShaderGeneratedCase,ctx);
  return iVar2;
}

Assistant:

void ComputeShaderGeneratedSeparateCase::init (void)
{
	// generate cmd compute shader

	if (m_computeCmd)
	{
		m_computeCmdProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genCmdComputeSource()));
		m_testCtx.getLog() << *m_computeCmdProgram;

		if (!m_computeCmdProgram->isOk())
			throw tcu::TestError("Failed to compile command compute shader.");
	}

	// generate data compute shader

	if (m_computeData)
	{
		m_computeDataProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genDataComputeSource()));
		m_testCtx.getLog() << *m_computeDataProgram;

		if (!m_computeDataProgram->isOk())
			throw tcu::TestError("Failed to compile data compute shader.");
	}

	// generate index compute shader

	if (m_computeIndices)
	{
		m_computeIndicesProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genIndexComputeSource()));
		m_testCtx.getLog() << *m_computeIndicesProgram;

		if (!m_computeIndicesProgram->isOk())
			throw tcu::TestError("Failed to compile data compute shader.");
	}

	// init parent
	ComputeShaderGeneratedCase::init();
}